

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScaleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  WeightParamType WVar5;
  int iVar6;
  int iVar7;
  ScaleLayerParams *this_00;
  WeightParams *pWVar8;
  string *psVar9;
  uint64 uVar10;
  allocator local_571;
  string local_570;
  allocator local_549;
  string local_548;
  Result local_528;
  allocator local_4f9;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  Result local_4b0;
  int local_484;
  uint64_t uStack_480;
  int i_1;
  size_t total_bias_shape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  undefined1 local_3f8 [8];
  string err_3;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  Result local_388;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  Result local_310;
  int local_2e4;
  uint64_t uStack_2e0;
  int i;
  size_t total_scale_shape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  string err_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string err;
  WeightParamType biasValueType;
  WeightParamType scaleValueType;
  bool has_bias;
  ScaleLayerParams *params;
  string local_148;
  Result local_128;
  allocator local_f9;
  string local_f8;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar3 = Result::good((Result *)local_48);
  if (bVar3) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar3 = Result::good((Result *)local_48);
  uVar2 = r.m_message.field_2._8_8_;
  if (!bVar3) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a27da7;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"Scale",&local_f9);
    validateInputOutputRankEquality
              (&local_d8,(NeuralNetworkLayer *)uVar2,&local_f8,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_d8);
    Result::~Result(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    bVar3 = Result::good((Result *)local_48);
    uVar2 = r.m_message.field_2._8_8_;
    if (!bVar3) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a27da7;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"Scale",(allocator *)((long)&params + 7));
    validateRankCount(&local_128,(NeuralNetworkLayer *)uVar2,&local_148,3,-1,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_128);
    Result::~Result(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar3 = Result::good((Result *)local_48);
    if (!bVar3) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a27da7;
    }
  }
  this_00 = Specification::NeuralNetworkLayer::scale
                      ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  bVar3 = Specification::ScaleLayerParams::hasbias(this_00);
  pWVar8 = Specification::ScaleLayerParams::scale(this_00);
  WVar5 = valueType(pWVar8);
  pWVar8 = Specification::ScaleLayerParams::bias(this_00);
  err.field_2._12_4_ = valueType(pWVar8);
  if ((WVar5 == UNSPECIFIED) || ((bVar3 && (err.field_2._12_4_ == UNSPECIFIED)))) {
    psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_1a8,"Scale layer \'",psVar9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   &local_1a8,"\' has invalid scale/bias fields.");
    std::__cxx11::string::~string((string *)&local_1a8);
    Result::Result((Result *)((long)&err_1.field_2 + 8),INVALID_MODEL_PARAMETERS,(string *)local_188
                  );
    Result::operator=((Result *)local_48,(Result *)((long)&err_1.field_2 + 8));
    Result::~Result((Result *)((long)&err_1.field_2 + 8));
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    std::__cxx11::string::~string((string *)local_188);
  }
  else if ((bVar3) &&
          (((WVar5 == FLOAT16 && (err.field_2._12_4_ == FLOAT32)) ||
           ((WVar5 == FLOAT32 && (err.field_2._12_4_ == FLOAT16)))))) {
    psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_210,"Scale layer \'",psVar9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   &local_210,
                   "\' has invalid scale/bias fields. Field value types should match and should either be half or full precision."
                  );
    std::__cxx11::string::~string((string *)&local_210);
    Result::Result((Result *)((long)&err_2.field_2 + 8),INVALID_MODEL_PARAMETERS,(string *)local_1f0
                  );
    Result::operator=((Result *)local_48,(Result *)((long)&err_2.field_2 + 8));
    Result::~Result((Result *)((long)&err_2.field_2 + 8));
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    std::__cxx11::string::~string((string *)local_1f0);
  }
  else {
    iVar6 = Specification::ScaleLayerParams::shapescale_size(this_00);
    if ((iVar6 == 1) ||
       (iVar6 = Specification::ScaleLayerParams::shapescale_size(this_00), iVar6 == 3)) {
      uStack_2e0 = 1;
      for (local_2e4 = 0; iVar6 = local_2e4,
          iVar7 = Specification::ScaleLayerParams::shapescale_size(this_00), iVar6 < iVar7;
          local_2e4 = local_2e4 + 1) {
        uVar10 = Specification::ScaleLayerParams::shapescale(this_00,local_2e4);
        uStack_2e0 = uVar10 * uStack_2e0;
      }
      iVar6 = Specification::ScaleLayerParams::shapescale_size(this_00);
      if ((iVar6 == 3) &&
         (uVar10 = Specification::ScaleLayerParams::shapescale(this_00,0), 1 < uVar10)) {
        pWVar8 = Specification::ScaleLayerParams::scale(this_00);
        uVar1 = uStack_2e0;
        uVar10 = Specification::ScaleLayerParams::shapescale(this_00,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_330,"Scale",&local_331);
        psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_358,"scale",&local_359);
        validateGeneralWeightParams(&local_310,pWVar8,uVar1,uVar10,&local_330,psVar9,&local_358);
        Result::operator=((Result *)local_48,&local_310);
        Result::~Result(&local_310);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator((allocator<char> *)&local_359);
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator((allocator<char> *)&local_331);
      }
      else {
        pWVar8 = Specification::ScaleLayerParams::scale(this_00);
        uVar1 = uStack_2e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3a8,"Scale",&local_3a9);
        psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3d0,"scale",(allocator *)(err_3.field_2._M_local_buf + 0xf));
        validateGeneralWeightParams(&local_388,pWVar8,uVar1,1,&local_3a8,psVar9,&local_3d0);
        Result::operator=((Result *)local_48,&local_388);
        Result::~Result(&local_388);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)(err_3.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      }
      bVar4 = Result::good((Result *)local_48);
      if (bVar4) {
        if (bVar3) {
          iVar6 = Specification::ScaleLayerParams::shapebias_size(this_00);
          if ((iVar6 != 1) &&
             (iVar6 = Specification::ScaleLayerParams::shapebias_size(this_00), iVar6 != 3)) {
            psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::operator+(&local_458,"The bias vector for scale layer \'",psVar9);
            std::operator+(&local_438,&local_458,"\' is ");
            iVar6 = Specification::ScaleLayerParams::shapebias_size(this_00);
            std::__cxx11::to_string((string *)&total_bias_shape,iVar6);
            std::operator+(&local_418,&local_438,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &total_bias_shape);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3f8,&local_418," dimensional but should be either 1D or 3D.");
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&total_bias_shape);
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&local_458);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_3f8);
            local_ac = 1;
            std::__cxx11::string::~string((string *)local_3f8);
            goto LAB_00a27da7;
          }
          uStack_480 = 1;
          for (local_484 = 0; iVar6 = local_484,
              iVar7 = Specification::ScaleLayerParams::shapebias_size(this_00), iVar6 < iVar7;
              local_484 = local_484 + 1) {
            uVar10 = Specification::ScaleLayerParams::shapebias(this_00,local_484);
            uStack_480 = uVar10 * uStack_480;
          }
          iVar6 = Specification::ScaleLayerParams::shapebias_size(this_00);
          if ((iVar6 == 3) &&
             (uVar10 = Specification::ScaleLayerParams::shapebias(this_00,0), 1 < uVar10)) {
            pWVar8 = Specification::ScaleLayerParams::bias(this_00);
            uVar1 = uStack_480;
            uVar10 = Specification::ScaleLayerParams::shapebias(this_00,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4d0,"Scale",&local_4d1);
            psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4f8,"bias",&local_4f9);
            validateGeneralWeightParams(&local_4b0,pWVar8,uVar1,uVar10,&local_4d0,psVar9,&local_4f8)
            ;
            Result::operator=((Result *)local_48,&local_4b0);
            Result::~Result(&local_4b0);
            std::__cxx11::string::~string((string *)&local_4f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
          }
          else {
            pWVar8 = Specification::ScaleLayerParams::bias(this_00);
            uVar1 = uStack_480;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_548,"Scale",&local_549);
            psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_570,"bias",&local_571);
            validateGeneralWeightParams(&local_528,pWVar8,uVar1,1,&local_548,psVar9,&local_570);
            Result::operator=((Result *)local_48,&local_528);
            Result::~Result(&local_528);
            std::__cxx11::string::~string((string *)&local_570);
            std::allocator<char>::~allocator((allocator<char> *)&local_571);
            std::__cxx11::string::~string((string *)&local_548);
            std::allocator<char>::~allocator((allocator<char> *)&local_549);
          }
          bVar3 = Result::good((Result *)local_48);
          if (!bVar3) {
            Result::Result(__return_storage_ptr__,(Result *)local_48);
            local_ac = 1;
            goto LAB_00a27da7;
          }
        }
        Result::Result(__return_storage_ptr__);
        local_ac = 1;
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_ac = 1;
      }
    }
    else {
      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+(&local_2b8,"The shape vector for the scale layer \'",psVar9);
      std::operator+(&local_298,&local_2b8,"\' is ");
      iVar6 = Specification::ScaleLayerParams::shapescale_size(this_00);
      std::__cxx11::to_string((string *)&total_scale_shape,iVar6);
      std::operator+(&local_278,&local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &total_scale_shape);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     &local_278," dimensional but should be 1D or 3D.");
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&total_scale_shape);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_258);
      local_ac = 1;
      std::__cxx11::string::~string((string *)local_258);
    }
  }
LAB_00a27da7:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScaleLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Scale", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Scale", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.scale();

    bool has_bias = params.hasbias();
    WeightParamType scaleValueType, biasValueType;
    scaleValueType = valueType(params.scale());
    biasValueType = valueType(params.bias());

    // Check for scale and bias value type. Only float32 or float16 parameters can be populated at any time.
    // Both bias and weights should have the same value types
    if ( (scaleValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Scale layer '" + layer.name() + "' has invalid scale/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((scaleValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (scaleValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            const std::string err = "Scale layer '" + layer.name() +
            "' has invalid scale/bias fields. Field value types should match and should either be half or full precision.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    // Checks scale shape and size
    if (!(params.shapescale_size() == 1 || params.shapescale_size() == 3)) { // check shape
        std::string err = "The shape vector for the scale layer '" + layer.name() + "' is " +
        std::to_string(params.shapescale_size()) + " dimensional but should be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    size_t total_scale_shape = 1;
    for (int i = 0; i < params.shapescale_size(); i++) {
        total_scale_shape *= params.shapescale(i);
    }

    if (params.shapescale_size() == 3 && params.shapescale(0) > 1){
        r = validateGeneralWeightParams(params.scale(), total_scale_shape, params.shapescale(0), "Scale", layer.name(), "scale");
    } else {
        r = validateGeneralWeightParams(params.scale(), total_scale_shape, 1, "Scale", layer.name(), "scale");
    }
    if (!r.good()) return r;

    // Checks bias shape and size
    if (has_bias) {
        if (!(params.shapebias_size() == 1 || params.shapebias_size() == 3)) {
            std::string err = "The bias vector for scale layer '" + layer.name() + "' is " +
            std::to_string(params.shapebias_size()) + " dimensional but should be either 1D or 3D.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        size_t total_bias_shape = 1;
        for (int i = 0; i < params.shapebias_size(); i++) {
            total_bias_shape *= params.shapebias(i);
        }
        if (params.shapebias_size() == 3 && params.shapebias(0) > 1){
            r = validateGeneralWeightParams(params.bias(), total_bias_shape, params.shapebias(0), "Scale", layer.name(), "bias");
        } else {
            r = validateGeneralWeightParams(params.bias(), total_bias_shape, 1, "Scale", layer.name(), "bias");
        }
        if (!r.good()) return r;
    }
    return Result();
}